

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O2

void vu_properties(t_gobj *z,_glist *owner)

{
  int iVar1;
  
  iVar1 = *(int *)((long)&z[3].g_pd[1].c_floatmethod + 4);
  iemgui_new_dialog(z,(t_iemgui *)z,"vu",(float)(*(int *)((long)&z[4].g_pd + 4) / iVar1),2.0,
                    (float)(*(int *)&z[4].g_pd / iVar1),8.0,0.0,0.0,0,
                    *(int *)((long)&z[0x4a].g_pd + 4),"no scale","scale",0,-1,-1);
  return;
}

Assistant:

static void vu_properties(t_gobj *z, t_glist *owner)
{
    t_vu *x = (t_vu *)z;

    iemgui_new_dialog(x, &x->x_gui, "vu",
                      x->x_gui.x_w/IEMGUI_ZOOM(x), IEM_SL_MINSIZE,
                      x->x_gui.x_h/IEMGUI_ZOOM(x), IEM_GUI_MINSIZE,
                      0, 0,
                      0,
                      x->x_scale, "no scale", "scale",
                      0, -1, -1);
}